

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall
wasm::WATParser::Lexer::Lexer
          (Lexer *this,string_view buffer,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *file)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *file_local;
  Lexer *this_local;
  string_view buffer_local;
  
  this->pos = 0;
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            (&this->annotations);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->file,file);
  (this->buffer)._M_len = buffer._M_len;
  (this->buffer)._M_str = buffer._M_str;
  setPos(this,0);
  return;
}

Assistant:

Lexer(std::string_view buffer, std::optional<std::string> file = std::nullopt)
    : file(file), buffer(buffer) {
    setPos(0);
  }